

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFilePrepend(char *name,void *buf,size_t count)

{
  int iVar1;
  bool_t bVar2;
  file_t pFVar3;
  blob_t count_00;
  file_t pFVar4;
  size_t c;
  void *buf1;
  size_t pos;
  size_t size;
  file_t file;
  err_t code;
  size_t buf1_size;
  file_t in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar5;
  file_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  err_t local_2c;
  err_t local_4;
  
  pFVar3 = fileOpen((char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    (char *)in_stack_ffffffffffffff98);
  iVar1 = 0xcb;
  if (pFVar3 != (file_t)0x0) {
    iVar1 = 0;
  }
  if (iVar1 == 0) {
    pFVar3 = (file_t)fileSize(in_stack_ffffffffffffffa8);
    if (pFVar3 == (file_t)0xffffffffffffffff) {
      fileClose((file_t)0x105173);
      local_4 = 0xcf;
    }
    else {
      count_00 = blobCreate((size_t)in_stack_ffffffffffffff98);
      local_2c = 0x6e;
      if (count_00 != (blob_t)0x0) {
        local_2c = 0;
      }
      if (local_2c == 0) {
        while (uVar5 = local_2c == 0 && pFVar3 != (file_t)0x0,
              local_2c == 0 && pFVar3 != (file_t)0x0) {
          in_stack_ffffffffffffff98 = pFVar3;
          if ((file_t)&DAT_00001000 < pFVar3) {
            in_stack_ffffffffffffff98 = (file_t)&DAT_00001000;
          }
          pFVar3 = (file_t)((long)pFVar3 - (long)in_stack_ffffffffffffff98);
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff98;
          bVar2 = fileSeek((file_t)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                           (size_t)in_stack_ffffffffffffff98,0);
          if (((bVar2 == 0) ||
              (pFVar4 = (file_t)fileRead2(pFVar3,(size_t)count_00,in_stack_ffffffffffffffa8),
              pFVar4 != in_stack_ffffffffffffffa8)) ||
             (bVar2 = fileSeek((file_t)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                               (size_t)in_stack_ffffffffffffff98,0), bVar2 == 0)) {
            local_2c = 0xcf;
          }
          else {
            local_2c = fileWrite((size_t *)in_stack_ffffffffffffffa8,
                                 (void *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                                 (size_t)in_stack_ffffffffffffff98,(file_t)0x10529d);
          }
        }
        blobClose((blob_t)0x1052b0);
        if (local_2c == 0) {
          bVar2 = fileSeek((file_t)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                           (size_t)in_stack_ffffffffffffff98,0);
          if (bVar2 == 0) {
            local_2c = 0xcf;
          }
          else {
            local_2c = fileWrite((size_t *)in_stack_ffffffffffffffa8,
                                 (void *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                                 (size_t)in_stack_ffffffffffffff98,(file_t)0x105303);
          }
          if (local_2c == 0) {
            bVar2 = fileClose((file_t)0x10532c);
            local_4 = 0x67;
            if (bVar2 != 0) {
              local_4 = 0;
            }
          }
          else {
            fileClose((file_t)0x105318);
            local_4 = local_2c;
          }
        }
        else {
          fileClose((file_t)0x1052c1);
          local_4 = local_2c;
        }
      }
      else {
        fileClose((file_t)0x1051b5);
        local_4 = local_2c;
      }
    }
  }
  else {
    pFVar3 = fileOpen((char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      (char *)in_stack_ffffffffffffff98);
    iVar1 = 0xcb;
    if (pFVar3 != (file_t)0x0) {
      iVar1 = 0;
    }
    if (iVar1 == 0) {
      fileClose((file_t)0x10512a);
      local_4 = 0xcb;
    }
    else {
      local_4 = cmdFileWrite(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             (size_t)in_stack_ffffffffffffffa8);
    }
  }
  return local_4;
}

Assistant:

err_t cmdFilePrepend(const char* name, const void* buf, size_t count)
{
	const size_t buf1_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf1;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(buf, count));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	if (code != ERR_OK)
	{
		// не открывается, но существует?
		code = cmdFileOpen(file, name, "rb");
		if (code == ERR_OK)
		{
			cmdFileClose(file);
			return ERR_FILE_OPEN;
		}
		// не существует => создать
		return cmdFileWrite(name, buf, count);
	}
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
	{
		cmdFileClose(file);
		return ERR_FILE_READ;
	}
	// сдвинуть содержимое файла вправо
	code = cmdBlobCreate(buf1, buf1_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = size; code == ERR_OK && pos;)
	{
		size_t c;
		c = MIN2(buf1_size, pos), pos -= c;
		if (!fileSeek(file, pos, SEEK_SET) ||
			fileRead2(buf1, c, file) != c ||
			!fileSeek(file, pos + count, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf1, c, file);
	}
	cmdBlobClose(buf1);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// дописать в начало
	if (!fileSeek(file, 0, SEEK_SET))
		code = ERR_FILE_READ;
	else
		code = fileWrite(&count, buf, count, file);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}